

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_field.h
# Opt level: O3

Type * __thiscall
google::protobuf::internal::RepeatedPtrFieldBase::
ReleaseLast<google::protobuf::internal::GenericTypeHandler<google::protobuf::Message>>
          (RepeatedPtrFieldBase *this)

{
  int iVar1;
  int iVar2;
  Rep *pRVar3;
  GenericTypeHandler<google::protobuf::Message> *this_00;
  GenericTypeHandler<google::protobuf::Message> *from;
  Message *to;
  
  pRVar3 = this->rep_;
  iVar1 = this->current_size_;
  this->current_size_ = iVar1 + -1;
  this_00 = (GenericTypeHandler<google::protobuf::Message> *)pRVar3->elements[(long)iVar1 + -1];
  iVar2 = pRVar3->allocated_size;
  pRVar3->allocated_size = iVar2 + -1;
  if (iVar1 < iVar2) {
    pRVar3->elements[(long)iVar1 + -1] = pRVar3->elements[(long)iVar2 + -1];
  }
  from = this_00;
  if (this->arena_ != (Arena *)0x0) {
    from = (GenericTypeHandler<google::protobuf::Message> *)
           GenericTypeHandler<google::protobuf::Message>::NewFromPrototype
                     ((Message *)this_00,(Arena *)0x0);
    GenericTypeHandler<google::protobuf::Message>::Merge(this_00,(Message *)from,to);
  }
  return (Type *)from;
}

Assistant:

inline typename TypeHandler::Type*
RepeatedPtrFieldBase::UnsafeArenaReleaseLast() {
  GOOGLE_DCHECK_GT(current_size_, 0);
  typename TypeHandler::Type* result =
      cast<TypeHandler>(rep_->elements[--current_size_]);
  --rep_->allocated_size;
  if (current_size_ < rep_->allocated_size) {
    // There are cleared elements on the end; replace the removed element
    // with the last allocated element.
    rep_->elements[current_size_] = rep_->elements[rep_->allocated_size];
  }
  return result;
}